

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O2

void coda_XML_ParserFree(XML_Parser parser)

{
  DTD *table;
  XML_Parser pXVar1;
  NAMED *pNVar2;
  TAG *pTVar3;
  TAG *pTVar4;
  OPEN_INTERNAL_ENTITY *pOVar5;
  OPEN_INTERNAL_ENTITY *pOVar6;
  HASH_TABLE_ITER local_38;
  
  if (parser == (XML_Parser)0x0) {
    return;
  }
  pTVar3 = parser->m_tagStack;
  do {
    pTVar4 = pTVar3;
    if (pTVar3 == (TAG *)0x0) {
      pTVar4 = parser->m_freeTagList;
      if (pTVar4 == (TAG *)0x0) {
        pOVar5 = parser->m_openInternalEntities;
        do {
          pOVar6 = pOVar5;
          if (pOVar5 == (OPEN_INTERNAL_ENTITY *)0x0) {
            pOVar6 = parser->m_freeInternalEntities;
            if (pOVar6 == (OPEN_INTERNAL_ENTITY *)0x0) {
              destroyBindings(parser->m_freeBindingList,parser);
              destroyBindings(parser->m_inheritedBindings,parser);
              poolDestroy(&parser->m_tempPool);
              poolDestroy(&parser->m_temp2Pool);
              (*(parser->m_mem).free_fcn)(parser->m_protocolEncodingName);
              if ((parser->m_isParamEntity == '\0') && (table = parser->m_dtd, table != (DTD *)0x0))
              {
                pXVar1 = parser->m_parentParser;
                local_38.p = (table->elementTypes).v;
                if (local_38.p == (NAMED **)0x0) {
                  local_38.end = (NAMED **)0x0;
                }
                else {
                  local_38.end = local_38.p + (table->elementTypes).size;
                }
                while( true ) {
                  pNVar2 = hashTableIterNext(&local_38);
                  if (pNVar2 == (NAMED *)0x0) break;
                  if (*(int *)((long)&pNVar2[3].name + 4) != 0) {
                    (*(parser->m_mem).free_fcn)(pNVar2[4].name);
                  }
                }
                hashTableDestroy(&table->generalEntities);
                hashTableDestroy(&table->paramEntities);
                hashTableDestroy(&table->elementTypes);
                hashTableDestroy(&table->attributeIds);
                hashTableDestroy(&table->prefixes);
                poolDestroy(&table->pool);
                poolDestroy(&table->entityValuePool);
                if (pXVar1 == (XML_Parser)0x0) {
                  (*(parser->m_mem).free_fcn)(table->scaffIndex);
                  (*(parser->m_mem).free_fcn)(table->scaffold);
                }
                (*(parser->m_mem).free_fcn)(table);
              }
              (*(parser->m_mem).free_fcn)(parser->m_atts);
              (*(parser->m_mem).free_fcn)(parser->m_groupConnector);
              (*(parser->m_mem).free_fcn)(parser->m_buffer);
              (*(parser->m_mem).free_fcn)(parser->m_dataBuf);
              (*(parser->m_mem).free_fcn)(parser->m_nsAtts);
              (*(parser->m_mem).free_fcn)(parser->m_unknownEncodingMem);
              if (parser->m_unknownEncodingRelease != (_func_void_void_ptr *)0x0) {
                (*parser->m_unknownEncodingRelease)(parser->m_unknownEncodingData);
              }
              (*(parser->m_mem).free_fcn)(parser);
              return;
            }
            parser->m_freeInternalEntities = (OPEN_INTERNAL_ENTITY *)0x0;
          }
          pOVar5 = pOVar6->next;
          (*(parser->m_mem).free_fcn)(pOVar6);
        } while( true );
      }
      parser->m_freeTagList = (TAG *)0x0;
    }
    pTVar3 = pTVar4->parent;
    (*(parser->m_mem).free_fcn)(pTVar4->buf);
    destroyBindings(pTVar4->bindings,parser);
    (*(parser->m_mem).free_fcn)(pTVar4);
  } while( true );
}

Assistant:

void XMLCALL
XML_ParserFree(XML_Parser parser) {
  TAG *tagList;
  OPEN_INTERNAL_ENTITY *entityList;
  if (parser == NULL)
    return;
  /* free m_tagStack and m_freeTagList */
  tagList = parser->m_tagStack;
  for (;;) {
    TAG *p;
    if (tagList == NULL) {
      if (parser->m_freeTagList == NULL)
        break;
      tagList = parser->m_freeTagList;
      parser->m_freeTagList = NULL;
    }
    p = tagList;
    tagList = tagList->parent;
    FREE(parser, p->buf);
    destroyBindings(p->bindings, parser);
    FREE(parser, p);
  }
  /* free m_openInternalEntities and m_freeInternalEntities */
  entityList = parser->m_openInternalEntities;
  for (;;) {
    OPEN_INTERNAL_ENTITY *openEntity;
    if (entityList == NULL) {
      if (parser->m_freeInternalEntities == NULL)
        break;
      entityList = parser->m_freeInternalEntities;
      parser->m_freeInternalEntities = NULL;
    }
    openEntity = entityList;
    entityList = entityList->next;
    FREE(parser, openEntity);
  }

  destroyBindings(parser->m_freeBindingList, parser);
  destroyBindings(parser->m_inheritedBindings, parser);
  poolDestroy(&parser->m_tempPool);
  poolDestroy(&parser->m_temp2Pool);
  FREE(parser, (void *)parser->m_protocolEncodingName);
#ifdef XML_DTD
  /* external parameter entity parsers share the DTD structure
     parser->m_dtd with the root parser, so we must not destroy it
  */
  if (! parser->m_isParamEntity && parser->m_dtd)
#else
  if (parser->m_dtd)
#endif /* XML_DTD */
    dtdDestroy(parser->m_dtd, (XML_Bool)! parser->m_parentParser,
               &parser->m_mem);
  FREE(parser, (void *)parser->m_atts);
#ifdef XML_ATTR_INFO
  FREE(parser, (void *)parser->m_attInfo);
#endif
  FREE(parser, parser->m_groupConnector);
  FREE(parser, parser->m_buffer);
  FREE(parser, parser->m_dataBuf);
  FREE(parser, parser->m_nsAtts);
  FREE(parser, parser->m_unknownEncodingMem);
  if (parser->m_unknownEncodingRelease)
    parser->m_unknownEncodingRelease(parser->m_unknownEncodingData);
  FREE(parser, parser);
}